

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O1

void __thiscall
Shm::Shm(Shm *this,int rank,int n_processes,int n_partners,int message_size,bool lock_each_iteration
        )

{
  int iVar1;
  int *piVar2;
  int **ppiVar3;
  MPI_Request *ppoVar4;
  ulong uVar5;
  MPI_Group shared_group;
  MPI_Group world_group;
  int ignore_disp_unit;
  MPI_Aint ignore_size;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  
  HalosExchange::HalosExchange(&this->super_HalosExchange,rank,n_processes,n_partners,message_size);
  (this->super_HalosExchange).super_Computation._vptr_Computation = (_func_int **)&PTR__Shm_00108cf0
  ;
  this->shmcomm = (MPI_Comm)0x0;
  this->win = (MPI_Win)0x0;
  this->message_size = message_size;
  this->lock_each_iteration = lock_each_iteration;
  MPI_Comm_split_type(&ompi_mpi_comm_world,0,0,&ompi_mpi_info_null,&this->shmcomm);
  MPI_Win_allocate_shared
            ((long)message_size,8,&ompi_mpi_info_null,this->shmcomm,
             &(this->super_HalosExchange).sbuf,&this->win);
  MPI_Comm_group(&ompi_mpi_comm_world,&local_48);
  MPI_Comm_group(this->shmcomm,&local_50);
  uVar5 = 0xffffffffffffffff;
  if (-1 < n_partners) {
    uVar5 = (long)n_partners * 4;
  }
  piVar2 = (int *)operator_new__(uVar5);
  this->partners_map = piVar2;
  MPI_Group_translate_ranks
            (local_48,n_partners,(this->super_HalosExchange).partners,local_50,piVar2);
  uVar5 = 0xffffffffffffffff;
  if (-1 < n_partners) {
    uVar5 = (long)n_partners << 3;
  }
  ppiVar3 = (int **)operator_new__(uVar5);
  this->partners_ptrs = ppiVar3;
  if (0 < n_partners) {
    uVar5 = 0;
    do {
      this->partners_ptrs[uVar5] = (int *)0x0;
      if (this->partners_map[uVar5] != -0x7ffe) {
        MPI_Win_shared_query
                  (this->win,this->partners_map[uVar5],local_38,local_3c,this->partners_ptrs + uVar5
                  );
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)n_partners);
  }
  this->n_inter_partners = 0;
  if (0 < n_partners) {
    iVar1 = this->n_inter_partners;
    uVar5 = 0;
    do {
      if (this->partners_map[uVar5] == -0x7ffe) {
        iVar1 = iVar1 + 1;
        this->n_inter_partners = iVar1;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)n_partners != uVar5);
  }
  if (0 < this->n_inter_partners) {
    ppoVar4 = (MPI_Request *)operator_new__((ulong)(uint)this->n_inter_partners << 4);
    (this->super_HalosExchange).reqs = ppoVar4;
  }
  return;
}

Assistant:

Shm(int rank, int n_processes, int n_partners, int message_size,
        bool lock_each_iteration) : HalosExchange(rank, n_processes, n_partners,
                                                  message_size)
    {
        this->message_size = message_size;
        this->lock_each_iteration = lock_each_iteration;
        // MPI_Comm_split_type will split the processes into disjointed subgroups
        // located on the same node. A new (shared memory) communicator is created
        // for each subgroup and returned in shmcomm.
        MPI_Comm_split_type(MPI_COMM_WORLD, MPI_COMM_TYPE_SHARED, 0,
                            MPI_INFO_NULL, &shmcomm);
        // MPI_Win_allocate_shared will create a window object with shared memory.
        // On each process, it allocates memory of message_size bytes that is shared
        // among all processes in shmcomm. The allocated memory is contiguous
        // across process ranks, which means that the first address in the memory
        // segment of process i is consecutive with the last address in the memory
        // segment of process i−1.
        MPI_Win_allocate_shared(message_size, sizeof(double), MPI_INFO_NULL,
                                shmcomm, &sbuf, &win);
        // We need to distinguish between processes located on the same node and
        // processes belonging to other nodes. Let us first create a global and
        // a shared MPI group.
        MPI_Group world_group, shared_group;
        MPI_Comm_group(MPI_COMM_WORLD, &world_group);
        MPI_Comm_group(shmcomm, &shared_group);
        // We can now map global ranks to shmcomm ranks via MPI_Group_translate_ranks.
        partners_map = new int[n_partners];
        MPI_Group_translate_ranks(world_group, n_partners, partners,
                                  shared_group, partners_map);
        // In order to exploit shared memory, we need to find out the local address
        // of each shared memory segment. MPI_Win_shared_query will return the base
        // pointer in this process' address space of the shared segment belonging
        // to a given target rank.
        partners_ptrs = new int*[n_partners];
        // MPI_Win_shared_query returns the local size and local displacement
        // size too, but we will ignore them.
        MPI_Aint ignore_size;
        int ignore_disp_unit;
        for (int i = 0; i < n_partners; i++)
        {
            partners_ptrs[i] = nullptr;
            if (partners_map[i] != MPI_UNDEFINED)
                MPI_Win_shared_query(win, partners_map[i], &ignore_size,
                                     &ignore_disp_unit, &partners_ptrs[i]);
        }
        // Let us compute the number of inter-node partners.
        n_inter_partners = 0;
        for (int i = 0; i < n_partners; i++)
            if (partners_map[i] == MPI_UNDEFINED) n_inter_partners++;
        if (n_inter_partners > 0)
            reqs = new MPI_Request[2 * n_inter_partners];
    }